

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O2

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromBundle(CollationLoader *this,UErrorCode *errorCode)

{
  char *__dest;
  uint uVar1;
  int iVar2;
  UResourceBundle *resB;
  CollationCacheEntry *pCVar3;
  UChar *us;
  uint uVar4;
  char *pcVar5;
  int32_t length;
  UErrorCode internalErrorCode;
  LocalUResourceBundlePointer def;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar5 = "collations";
    resB = ures_getByKey_63(this->bundle,"collations",(UResourceBundle *)0x0,errorCode);
    this->collations = resB;
    if (*errorCode == U_MISSING_RESOURCE_ERROR) {
      *errorCode = U_USING_DEFAULT_WARNING;
      pCVar3 = makeCacheEntryFromRoot(this,(Locale *)pcVar5,errorCode);
      return pCVar3;
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      internalErrorCode = U_ZERO_ERROR;
      def.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)
           ures_getByKeyWithFallback_63(resB,"default",(UResourceBundle *)0x0,&internalErrorCode);
      us = ures_getString_63((UResourceBundle *)def.super_LocalPointerBase<UResourceBundle>.ptr,
                             &length,&internalErrorCode);
      pcVar5 = this->defaultType;
      if (length - 1U < 0xf && internalErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        u_UCharsToChars_63(us,pcVar5,length + 1);
      }
      else {
        builtin_strncpy(pcVar5,"standard",9);
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&def);
      __dest = this->type;
      if (this->type[0] != '\0') {
        iVar2 = strcmp(__dest,pcVar5);
        if (iVar2 == 0) {
          *(byte *)&this->typesTried = (byte)this->typesTried | 2;
        }
        iVar2 = bcmp(__dest,"search",7);
        if (iVar2 == 0) {
          *(byte *)&this->typesTried = (byte)this->typesTried | 1;
        }
        iVar2 = bcmp(__dest,"standard",9);
        if (iVar2 == 0) {
          *(byte *)&this->typesTried = (byte)this->typesTried | 4;
        }
        pCVar3 = loadFromCollations(this,errorCode);
        return pCVar3;
      }
      strcpy(__dest,pcVar5);
      uVar1 = this->typesTried;
      uVar4 = uVar1 | 2;
      this->typesTried = uVar4;
      iVar2 = bcmp(__dest,"search",7);
      if (iVar2 == 0) {
        uVar4 = uVar1 | 3;
        this->typesTried = uVar4;
      }
      iVar2 = bcmp(__dest,"standard",9);
      if (iVar2 == 0) {
        this->typesTried = uVar4 | 4;
      }
      Locale::setKeywordValue(&this->locale,"collation",__dest,errorCode);
      pCVar3 = getCacheEntry(this,errorCode);
      return pCVar3;
    }
  }
  return (CollationCacheEntry *)0x0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}